

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerTraversalDecoder::DecodeStartFaceConfiguration
          (MeshEdgebreakerTraversalDecoder *this)

{
  bool bVar1;
  uint32_t face_configuration;
  uint32_t local_c;
  
  if ((this->buffer_).bitstream_version_ < 0x202) {
    DecoderBuffer::DecodeLeastSignificantBits32(&this->start_face_buffer_,1,&local_c);
    return local_c != 0;
  }
  bVar1 = RAnsBitDecoder::DecodeNextBit(&this->start_face_decoder_);
  return bVar1;
}

Assistant:

inline bool DecodeStartFaceConfiguration() {
    uint32_t face_configuration;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (buffer_.bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
      start_face_buffer_.DecodeLeastSignificantBits32(1, &face_configuration);

    } else
#endif
    {
      face_configuration = start_face_decoder_.DecodeNextBit();
    }
    return face_configuration;
  }